

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

FT_UShort __thiscall FreeTypeFaceWrapper::GetFontWeight(FreeTypeFaceWrapper *this)

{
  int iVar1;
  FT_UShort result;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    this_local._6_2_ = WeightFromName(this);
  }
  else {
    iVar1 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[7])();
    this_local._6_2_ = (FT_UShort)iVar1;
    if (this_local._6_2_ == 1000) {
      this_local._6_2_ = WeightFromName(this);
    }
  }
  return this_local._6_2_;
}

Assistant:

FT_UShort FreeTypeFaceWrapper::GetFontWeight()
{
	if(mFormatParticularWrapper)
	{
		FT_UShort result = mFormatParticularWrapper->GetFontWeight();
		if(1000 == result) // 1000 marks unknown
			return WeightFromName();
		else
			return result;
	}
	return WeightFromName();
}